

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void GEO::sort_unique<GEO::vector<unsigned_int>>(vector<unsigned_int> *v)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  __first;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((v->super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
             super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (v->super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
             super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      ((v->
                       super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                       ).
                       super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (v->
                       super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                       ).
                       super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::erase
            (&v->super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>,
             (const_iterator)__first._M_current,
             (const_iterator)
             (v->super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
             super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

inline void sort_unique(VECTOR& v) {
        std::sort(v.begin(), v.end());
        // Note that std::unique leaves a 'queue' of duplicated elements
        // at the end of the vector, and returns an iterator that
        // indicates where to stop. 
        v.erase(
            std::unique(v.begin(), v.end()), v.end()
        );
    }